

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,1,0,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  void *pvVar1;
  comm *comm_00;
  _Map_pointer pppVar2;
  _Map_pointer pppVar3;
  comm *comm_01;
  unsigned_long uVar4;
  _Elt_pointer ppVar5;
  _Elt_pointer ppVar6;
  _Map_pointer pppVar7;
  _Map_pointer pppVar8;
  ulong uVar9;
  ulong uVar10;
  pointer puVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  _Elt_pointer ppVar15;
  long lVar16;
  _Elt_pointer ppVar17;
  unsigned_long uVar18;
  unsigned_long uVar19;
  unsigned_long uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  long lVar24;
  bool bVar25;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1c8;
  ulong local_178;
  comm *local_170;
  _Elt_pointer local_168;
  _Elt_pointer local_160;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_158;
  _Elt_pointer local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  _Map_pointer local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_128;
  pair<unsigned_long,_unsigned_long> local_120;
  ulong local_110;
  size_t local_108;
  size_type local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Map_pointer local_80;
  _Elt_pointer local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_168 = (_Elt_pointer)left_nsv;
  local_158 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_128 = right_nsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1c8,0);
  local_100 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  uVar4 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_100,comm);
  lVar24 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar24 != 0) {
    lVar24 = lVar24 >> 3;
    local_178 = uVar4 - 1;
LAB_0012d5d6:
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar24 + -1] < ppVar5[-1].first) {
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0012d5d6;
        }
      }
      while (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar24 + -1] != ppVar5[-1].first) break;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_178 + lVar24);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar24 + -1];
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  local_50.current._M_cur = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_148,&local_50,&local_70,(allocator_type *)&local_98);
  pvVar1 = *(void **)local_158;
  *(pointer *)local_158 =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_158 + 8) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_158 + 0x10) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  local_170 = comm;
  local_108 = nonsv;
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_160 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_178 = ((long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x20;
  local_150 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar8 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_178 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; pppVar8 < pppVar3; pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar5;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = local_150;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = local_160;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
LAB_0012d890:
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] < ppVar5[-1].first) {
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0012d890;
        }
      }
      while (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] != ppVar5[-1].first) break;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar9 + uVar4);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar9];
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(in->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar9 = (long)local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node -
          (long)local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar25 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_160 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1c8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1c8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_130 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_158,*(undefined8 *)(local_158 + 8));
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar24 = (long)ppVar5 - (long)local_160;
  local_160 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_110 = (local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar24 = (lVar24 >> 4) + ((long)ppVar17 - (long)ppVar6 >> 4) +
           (((uVar9 >> 3) - 1) + (ulong)bVar25) * 0x20;
  ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar8 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_170;
  if (lVar24 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; local_150 = ppVar5, local_170 = comm_00, pppVar8 < pppVar3; pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
    ppVar5 = local_150;
    comm_00 = local_170;
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_160;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = local_150;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = local_78;
  if (lVar24 + local_178 != *(long *)(local_158 + 8) - *(long *)local_158 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_148,&local_110,1,comm_00);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)comm_00->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_f8);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)comm_00->m_size,(value_type_conflict *)&local_f8,
             (allocator_type *)&local_c8);
  comm_01 = local_170;
  iVar13 = comm_00->m_rank;
  lVar24 = (long)iVar13;
  if (0 < lVar24) {
    uVar9 = *(ulong *)((long)local_148.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -8);
    lVar14 = lVar24;
    uVar18 = 0;
    do {
      lVar16 = lVar14 + -1;
      uVar10 = uVar18 + 1;
      if (uVar18 + 1 < local_178) {
        uVar10 = local_178;
      }
      puVar23 = (ulong *)(uVar18 * 0x10 + *(long *)local_158);
      uVar19 = uVar18 - 1;
      do {
        uVar20 = uVar10 - 1;
        if ((1 - uVar10) + uVar19 == -1) break;
        uVar22 = *puVar23;
        uVar20 = uVar19 + 1;
        puVar23 = puVar23 + 2;
        uVar19 = uVar20;
      } while (*(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar16 * 8) <= uVar22);
      uVar10 = *(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar16 * 8);
      iVar12 = 0x12;
      if (uVar10 <= uVar9) {
        *(unsigned_long *)
         ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar16 * 8) = (uVar20 - uVar18) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar16] = uVar18;
        iVar12 = (uint)(*(ulong *)((long)local_148.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar16 * 8) <
                       local_110) << 4;
        uVar9 = uVar10;
      }
    } while (((iVar12 == 0x12) || (iVar12 == 0)) &&
            (bVar25 = 1 < lVar14, lVar14 = lVar16, uVar18 = uVar20, bVar25));
  }
  iVar12 = local_170->m_size;
  if ((iVar13 < iVar12 + -1) && (iVar13 + 1 < iVar12)) {
    lVar14 = *(long *)local_158;
    uVar9 = ((unsigned_long *)
            ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + 8))[lVar24];
    lVar24 = lVar24 + 1;
    uVar10 = (*(long *)(local_158 + 8) - lVar14 >> 4) - 1;
    do {
      uVar22 = uVar10;
      if (local_178 < uVar10) {
        puVar23 = (ulong *)(uVar10 * 0x10 + lVar14);
        uVar21 = uVar10;
        do {
          uVar22 = uVar21;
          if (*puVar23 <
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24]) break;
          uVar21 = uVar21 - 1;
          puVar23 = puVar23 + -2;
          uVar22 = local_178;
        } while (local_178 < uVar21);
      }
      uVar21 = local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar24];
      iVar13 = 0x17;
      if (uVar21 <= uVar9) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] = (uVar10 - uVar22) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] = uVar22;
        iVar13 = 0;
        uVar9 = uVar21;
        if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar24] < local_110) {
          iVar13 = 0x15;
        }
      }
    } while (((iVar13 == 0x17) || (iVar13 == 0)) &&
            (lVar24 = lVar24 + 1, uVar10 = uVar22, iVar12 != (int)lVar24));
  }
  mxx::all2all<unsigned_long>(&local_f8,&local_98,local_170);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_f8);
  uVar18 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar19 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_e0,uVar18 + uVar19,(allocator_type *)&local_120);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_158,&local_98,&local_b0,
             local_e0.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f8,&local_c8,comm_01);
  local_178 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  local_150 = (_Elt_pointer)(uVar18 + uVar19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,local_100);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_128,local_100);
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_170 = (comm *)local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_160 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  for (pppVar8 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node; pppVar8 < pppVar3;
      pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar5;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  lVar24 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)local_170;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = local_160;
  if (lVar24 != 0) {
    lVar24 = lVar24 >> 3;
    local_170 = (comm *)(uVar4 - 1);
    do {
      uVar18 = (long)local_170 + lVar24;
      lVar24 = lVar24 + -1;
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar11 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        bVar25 = false;
        do {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          uVar9 = puVar11[lVar24];
          if (ppVar5[-1].first <= uVar9) {
            if (!bVar25) {
              ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (uVar9 == ppVar5[-1].first) {
                ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)
                ->_M_impl).super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar18;
                if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
                }
                else {
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
              }
            }
            break;
          }
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar18;
          if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar25 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        } while (!bVar25);
      }
      local_120.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar24];
      local_120.second = uVar18;
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,&local_120);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_120.first;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar18;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar24 != 0);
  }
  if (local_178 != 0) {
    uVar9 = 0;
    local_170 = (comm *)(local_178 << 4);
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar23 = (ulong *)((long)&local_e0.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[~uVar9].first +
                         (long)local_170);
      uVar18 = *(unsigned_long *)
                ((long)&local_e0.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[~uVar9].second + (long)local_170);
      bVar25 = false;
      do {
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar10 = *puVar23;
        if (ppVar5[-1].first <= uVar10) {
          if (!bVar25) {
            ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            if (uVar10 == ppVar5[-1].first) {
              ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
              _M_impl).super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar18;
              if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            }
          }
          break;
        }
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar18;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        bVar25 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (!bVar25);
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_178);
  }
  pppVar3 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_170 = (comm *)local_1c8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar8 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar11 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168->first)->
              _M_impl).super__Vector_impl_data._M_start;
    ppVar6 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pppVar7 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar15 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar6 == ppVar15) {
        puVar11[pppVar7[-1][0x1f].second - uVar4] = local_108;
        ppVar15 = pppVar7[-1];
        pppVar7 = pppVar7 + -1;
        ppVar6 = ppVar15 + 0x20;
      }
      else {
        puVar11[ppVar6[-1].second - uVar4] = local_108;
      }
      ppVar6 = ppVar6 + -1;
      ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_start._M_first;
    } while (ppVar6 != local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_168 = ppVar17, pppVar8 < pppVar3; pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
    ppVar17 = local_168;
  }
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar5;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  puVar11 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = local_168;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)local_170;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    uVar9 = 0;
    do {
      uVar18 = uVar9 + uVar4;
      while (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar5[-1].first <= puVar11[uVar9]) break;
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        (local_128->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar18;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_120.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar9];
      local_120.second = uVar18;
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1c8,&local_120);
      }
      else {
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_120.first;
        (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar18;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar9 = uVar9 + 1;
      puVar11 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(in->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 3)
            );
  }
  if (local_150 != (_Elt_pointer)local_178) {
    lVar14 = (long)local_150 - local_178;
    lVar24 = 0;
    local_178 = local_178 << 4;
    do {
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar23 = (ulong *)((long)&local_e0.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar24].first + local_178
                         );
      uVar18 = *(unsigned_long *)
                ((long)&local_e0.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar24].second + local_178);
      do {
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar5[-1].first <= *puVar23) break;
        ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        (local_128->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar18;
        if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      } while (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur);
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar14 + (ulong)(lVar14 == 0));
  }
  if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar11 = (local_128->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pppVar8 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar5 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar17 = local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar5 == ppVar17) {
        puVar11[pppVar8[-1][0x1f].second - uVar4] = local_108;
        ppVar17 = pppVar8[-1];
        pppVar8 = pppVar8 + -1;
        ppVar5 = ppVar17 + 0x20;
      }
      else {
        puVar11[ppVar5[-1].second - uVar4] = local_108;
      }
      ppVar5 = ppVar5 + -1;
    } while (ppVar5 != local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_158,&local_e0);
  if (local_e0.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1c8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}